

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

TSmallArrayVector * __thiscall
glslang::TSmallArrayVector::operator=(TSmallArrayVector *this,TSmallArrayVector *from)

{
  TSmallArrayVector *from_local;
  TSmallArrayVector *this_local;
  
  if (from->sizes == (TVector<glslang::TArraySize> *)0x0) {
    this->sizes = (TVector<glslang::TArraySize> *)0x0;
  }
  else {
    alloc(this);
    TVector<glslang::TArraySize>::operator=(this->sizes,from->sizes);
  }
  return this;
}

Assistant:

TSmallArrayVector& operator=(const TSmallArrayVector& from)
    {
        if (from.sizes == nullptr)
            sizes = nullptr;
        else {
            alloc();
            *sizes = *from.sizes;
        }

        return *this;
    }